

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

iterator * cs_impl::array_cs_ext::next(iterator *it)

{
  undefined8 in_RSI;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *in_RDI;
  
  std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator++
            (in_RDI,(int)((ulong)in_RSI >> 0x20));
  return in_RDI;
}

Assistant:

array::iterator next(array::iterator &it)
		{
			return it++;
		}